

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

_Bool upb_MapIterator_Done(upb_Map *map,size_t iter)

{
  _Bool _Var1;
  upb_strtable_iter i;
  upb_strtable_iter local_10;
  
  if (iter != 0xffffffffffffffff) {
    local_10.t = &map->table;
    local_10.index = iter;
    _Var1 = upb_strtable_done(&local_10);
    return _Var1;
  }
  __assert_fail("iter != ((size_t) - 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/message/map.c"
                ,0x60,"_Bool upb_MapIterator_Done(const upb_Map *, size_t)");
}

Assistant:

bool upb_MapIterator_Done(const upb_Map* map, size_t iter) {
  upb_strtable_iter i;
  UPB_ASSERT(iter != kUpb_Map_Begin);
  i.t = &map->table;
  i.index = iter;
  return upb_strtable_done(&i);
}